

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

bool is_affected_room(ROOM_INDEX_DATA *room,int sn)

{
  ROOM_AFFECT_DATA *paf;
  int sn_local;
  ROOM_INDEX_DATA *room_local;
  
  if (room != (ROOM_INDEX_DATA *)0x0) {
    for (paf = room->affected; paf != (ROOM_AFFECT_DATA *)0x0; paf = paf->next) {
      if (paf->type == sn) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_affected_room(ROOM_INDEX_DATA *room, int sn)
{
	ROOM_AFFECT_DATA *paf;

	if (!room)
		return false;

	for (paf = room->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->type == sn)
			return true;
	}

	return false;
}